

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAutoTableElement.cpp
# Opt level: O0

void __thiscall
KDReports::AutoTableElement::AutoTableElement(AutoTableElement *this,AutoTableElement *other)

{
  AutoTableElementPrivate *this_00;
  type pAVar1;
  AutoTableElement *other_local;
  AutoTableElement *this_local;
  
  AbstractTableElement::AbstractTableElement
            (&this->super_AbstractTableElement,&other->super_AbstractTableElement);
  (this->super_AbstractTableElement).super_Element._vptr_Element =
       (_func_int **)&PTR__AutoTableElement_001c8288;
  this_00 = (AutoTableElementPrivate *)operator_new(0x78);
  pAVar1 = std::
           unique_ptr<KDReports::AutoTableElementPrivate,_std::default_delete<KDReports::AutoTableElementPrivate>_>
           ::operator*(&other->d);
  AutoTableElementPrivate::AutoTableElementPrivate(this_00,pAVar1);
  std::
  unique_ptr<KDReports::AutoTableElementPrivate,std::default_delete<KDReports::AutoTableElementPrivate>>
  ::unique_ptr<std::default_delete<KDReports::AutoTableElementPrivate>,void>
            ((unique_ptr<KDReports::AutoTableElementPrivate,std::default_delete<KDReports::AutoTableElementPrivate>>
              *)&this->d,this_00);
  return;
}

Assistant:

KDReports::AutoTableElement::AutoTableElement(const AutoTableElement &other)
    : AbstractTableElement(other)
    , d(new AutoTableElementPrivate(*other.d))
{
}